

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Limiter.h
# Opt level: O2

Code __thiscall Limiter::ValidateRequest(Limiter *this)

{
  Code CVar1;
  
  std::mutex::lock(&this->mutex_);
  CVar1 = TooManyRequests;
  if ((this->hitQueue_).activeHitsSum_ < this->maxRPS_) {
    CVar1 = Ok;
    HitQueue::AddHit(&this->hitQueue_);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return CVar1;
}

Assistant:

HttpResult::Code ValidateRequest()
    {
        std::lock_guard<std::mutex> l(mutex_);
        if (hitQueue_.ActiveSum() >= maxRPS_)
        {
            return HttpResult::Code::TooManyRequests;
        }
        hitQueue_.AddHit();
        return HttpResult::Code::Ok;
    }